

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::processPriorityCommand(CommonCore *this,ActionMessage *command)

{
  BrokerBase *this_00;
  ushort uVar1;
  action_t aVar2;
  int iVar3;
  pointer pcVar4;
  size_type sVar5;
  TimeoutMonitor *this_01;
  byte *pbVar6;
  size_t sVar7;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  bool bVar8;
  __type_conflict _Var9;
  FederateState *pFVar10;
  _func_int **pp_Var11;
  string *__lhs;
  ActionMessage *in_RDX;
  ActionMessage *command_00;
  int iVar12;
  GlobalFederateId GVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view federateName;
  string_view federateName_00;
  string_view estring;
  string_view federateName_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  optional<unsigned_long> oVar14;
  string_view fmt;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view searchValue;
  string_view existingValue;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view fmt_00;
  string_view estring_00;
  format_args args;
  format_args args_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  allocator<char> local_189;
  ActionMessage *local_188;
  string local_180;
  CommonCore *local_160;
  string local_158;
  size_t local_138;
  char *pcStack_130;
  GlobalFederateId local_128;
  InterfaceHandle IStack_124;
  undefined1 auStack_120 [24];
  undefined8 local_108;
  char *pcStack_100;
  size_t local_f8;
  char *pcStack_f0;
  ActionMessage pngrep;
  
  this_00 = &this->super_BrokerBase;
  if (0x17 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
    GVar13.gid = (this->super_BrokerBase).global_broker_id_local.gid;
    pcVar4 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    sVar5 = (this->super_BrokerBase).identifier._M_string_length;
    local_160 = this;
    prettyPrintString_abi_cxx11_(&local_158,(helics *)command,in_RDX);
    pngrep._0_8_ = local_158._M_dataplus._M_p;
    pngrep.source_id.gid = (undefined4)local_158._M_string_length;
    pngrep.source_handle.hid = local_158._M_string_length._4_4_;
    pngrep.dest_id.gid = (command->source_id).gid;
    fmt.size_ = 0x1d;
    fmt.data_ = (char *)0x1a;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&pngrep;
    local_188 = command;
    ::fmt::v11::vformat_abi_cxx11_(&local_180,(v11 *)"|| priority_cmd:{} from {}",fmt,args);
    local_f8 = local_180._M_string_length;
    pcStack_f0 = local_180._M_dataplus._M_p;
    in_R9.values_ = (value<fmt::v11::context> *)0x0;
    message._M_str = local_180._M_dataplus._M_p;
    message._M_len = local_180._M_string_length;
    name._M_str = pcVar4;
    name._M_len = sVar5;
    BrokerBase::sendToLogger(this_00,GVar13,0x18,name,message,false);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_158);
    this = local_160;
    command = local_188;
  }
  aVar2 = command->messageAction;
  if ((uint)(aVar2 + ~(cmd_reg_broker|cmd_tick)) < 2) {
LAB_0024f517:
    processQueryCommand(this,command);
    return;
  }
  if (aVar2 == cmd_set_global) {
    iVar3 = (this->super_BrokerBase).global_broker_id_local.gid;
    if (iVar3 == 0) {
LAB_0024f99c:
      gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::push<helics::ActionMessage>
                (&this->delayTransmitQueue,command);
      return;
    }
    (command->source_id).gid = iVar3;
    pp_Var11 = (this->super_Core)._vptr_Core;
LAB_0024f75f:
    (*pp_Var11[0x6c])(this,0,command);
    return;
  }
  if (aVar2 == cmd_reg_broker) {
    __x._M_str = (char *)(command->payload).heap;
    __x._M_len = (command->payload).bufferSize;
    __y._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    __y._M_len = (this->super_BrokerBase).identifier._M_string_length;
    bVar8 = std::operator==(__x,__y);
    if (bVar8) {
      local_108 = 0x68;
      pcStack_100 = 
      "received locally sent registration message, broker loop, please set the broker address to a valid broker"
      ;
      message_00._M_str =
           "received locally sent registration message, broker loop, please set the broker address to a valid broker"
      ;
      message_00._M_len = 0x68;
      name_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      name_00._M_len = (this->super_BrokerBase).identifier._M_string_length;
      BrokerBase::sendToLogger
                (this_00,(GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,0,
                 name_00,message_00,false);
      return;
    }
    auStack_120._8_8_ = 0x43;
    auStack_120._16_8_ = "Core received reg broker message, likely improper federation setup\n";
    message_01._M_str = "Core received reg broker message, likely improper federation setup\n";
    message_01._M_len = 0x43;
    name_01._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    name_01._M_len = (this->super_BrokerBase).identifier._M_string_length;
    BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,3,name_01,message_01,false);
    (*(this->super_Core)._vptr_Core[0x6b])(this,0,command);
    return;
  }
  if (aVar2 == cmd_broker_location) {
    ActionMessage::setAction(command,cmd_protocol);
    command->messageID = 0x14d;
    (*(this->super_Core)._vptr_Core[0x6c])(this,0xffffffffffffffff,command);
    ActionMessage::ActionMessage(&pngrep,cmd_resend);
    pngrep.messageID = -0x10000028;
    BrokerBase::addActionMessage(this_00,&pngrep);
LAB_0024f576:
    ActionMessage::~ActionMessage(&pngrep);
    return;
  }
  if (aVar2 == cmd_priority_ack) {
    return;
  }
  if (aVar2 == cmd_reg_fed) {
    sVar7 = (command->payload).bufferSize;
    pbVar6 = (command->payload).heap;
    federateName._M_str = (char *)pbVar6;
    federateName._M_len = sVar7;
    pngrep._0_8_ = getFederate(this,federateName);
    oVar14 = gmlc::containers::
             DualStringMappedVector<helics::FedInfo,helics::GlobalFederateId,(reference_stability)0,5>
             ::insert<helics::FederateState*>
                       ((DualStringMappedVector<helics::FedInfo,helics::GlobalFederateId,(reference_stability)0,5>
                         *)&this->loopFederates,sVar7,pbVar6);
    if ((((undefined1  [16])
          oVar14.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
         (undefined1  [16])0x0) && ((command->flags & 0x400) != 0)) {
      searchValue._M_str = (char *)(command->payload).heap;
      searchValue._M_len = (command->payload).bufferSize;
      gmlc::containers::
      DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
      find((BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> *)&pngrep,&this->loopFederates,
           searchValue);
      *(undefined1 *)(pngrep._8_8_ + 8) = 0;
    }
    iVar3 = (this->super_BrokerBase).global_broker_id_local.gid;
    if (iVar3 == 0) goto LAB_0024f99c;
    (command->source_id).gid = iVar3;
    pp_Var11 = (this->super_Core)._vptr_Core;
    goto LAB_0024f75f;
  }
  if (aVar2 != cmd_send_command) {
    if (aVar2 == cmd_broker_query) goto LAB_0024f517;
    if (aVar2 == cmd_broker_ack) {
      __x_00._M_str = (char *)(command->payload).heap;
      __x_00._M_len = (command->payload).bufferSize;
      __y_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      __y_00._M_len = (this->super_BrokerBase).identifier._M_string_length;
      bVar8 = std::operator==(__x_00,__y_00);
      if (!bVar8) {
        return;
      }
      if ((command->flags & 0x10) != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"broker responded with error: ",&local_189);
        errorMessageString_abi_cxx11_(&local_158,(helics *)command,command_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pngrep,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_180,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_180);
        estring_00._M_str = (char *)pngrep._0_8_;
        estring_00._M_len._0_4_ = pngrep.source_id.gid;
        estring_00._M_len._4_4_ = pngrep.source_handle.hid;
        BrokerBase::setErrorState(this_00,command->messageID,estring_00);
        estring._M_str = (char *)pngrep._0_8_;
        estring._M_len._0_4_ = pngrep.source_id.gid;
        estring._M_len._4_4_ = pngrep.source_handle.hid;
        errorRespondDelayedMessages(this,estring);
        local_128.gid = pngrep.source_id.gid;
        IStack_124.hid = pngrep.source_handle.hid;
        auStack_120._0_4_ = pngrep.messageAction;
        auStack_120._4_4_ = pngrep.messageID;
        message_03._M_str = (char *)pngrep._0_8_;
        message_03._M_len._0_4_ = pngrep.source_id.gid;
        message_03._M_len._4_4_ = pngrep.source_handle.hid;
        name_03._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name_03._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,0,name_03,message_03,false);
        std::__cxx11::string::~string((string *)&pngrep);
        return;
      }
      iVar3 = (command->dest_id).gid;
      LOCK();
      (this->super_BrokerBase).global_id._M_i.gid = iVar3;
      UNLOCK();
      iVar12 = 0x6fffffff;
      if (iVar3 != 1) {
        iVar12 = iVar3 * -3 + -0x40000006;
      }
      (this->super_BrokerBase).global_broker_id_local.gid = iVar3;
      LOCK();
      (this->filterFedID)._M_i.gid = iVar12;
      UNLOCK();
      iVar12 = 0x6ffffffe;
      if (iVar3 != 1) {
        iVar12 = iVar3 * -3 + -0x40000005;
      }
      LOCK();
      (this->translatorFedID)._M_i.gid = iVar12;
      UNLOCK();
      (((this->super_BrokerBase).timeCoord._M_t.
        super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
        ._M_t.
        super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
        .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->mSourceId).gid =
           iVar3;
      (this->super_BrokerBase).higher_broker_id.gid = (command->source_id).gid;
      transmitDelayedMessages(this);
      this_01 = (this->timeoutMon)._M_t.
                super___uniq_ptr_impl<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                ._M_t.
                super__Tuple_impl<0UL,_helics::TimeoutMonitor_*,_std::default_delete<helics::TimeoutMonitor>_>
                .super__Head_base<0UL,_helics::TimeoutMonitor_*,_false>._M_head_impl;
      (this_01->parentConnection).connection.gid = (this->super_BrokerBase).higher_broker_id.gid;
      uVar1 = command->flags;
      if ((uVar1 >> 0xe & 1) != 0) {
        (this_01->parentConnection).disablePing = true;
        (this_01->parentConnection).waitingForPingReply = false;
      }
      if (((uVar1 & 0x20) != 0) && ((this->super_BrokerBase).globalTime = true, (char)uVar1 < '\0'))
      {
        (this->super_BrokerBase).asyncTime = true;
      }
      if ((uVar1 >> 0xb & 1) != 0) {
        (this->super_BrokerBase).globalDisconnect = true;
      }
      TimeoutMonitor::reset(this_01);
      if (-1 < (this->delayInitCounter).super___atomic_base<short>._M_i) {
        return;
      }
      if ((this->super_BrokerBase).minFederateCount != 0) {
        return;
      }
      if ((this->super_BrokerBase).minChildCount != 0) {
        return;
      }
      bVar8 = allInitReady(this);
      if (!bVar8) {
        return;
      }
      bVar8 = BrokerBase::transitionBrokerState(this_00,CONNECTED,INITIALIZING);
      if (!bVar8) {
        return;
      }
      ActionMessage::ActionMessage(&pngrep,cmd_init);
      if (((this->initIterations)._M_base._M_i & 1U) != 0) {
        pngrep.flags._0_1_ = (byte)pngrep.flags | 1;
      }
      checkDependencies(this);
      pngrep.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      pngrep._16_8_ = pngrep._16_8_ & 0xffffffff00000000;
      (*(this->super_Core)._vptr_Core[0x6b])(this,0);
    }
    else {
      if (aVar2 == cmd_fed_ack) {
        federateName_00._M_str = (char *)(command->payload).heap;
        federateName_00._M_len = (command->payload).bufferSize;
        pFVar10 = getFederateCore(this,federateName_00);
        if (pFVar10 == (FederateState *)0x0) {
          return;
        }
        if ((command->flags & 0x10) == 0) {
          LOCK();
          (pFVar10->global_id)._M_i.gid = (command->dest_id).gid;
          UNLOCK();
          existingValue._M_str = (char *)(command->payload).heap;
          existingValue._M_len = (command->payload).bufferSize;
          gmlc::containers::
          DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
          ::addSearchTerm(&this->loopFederates,&command->dest_id,existingValue);
          iVar3 = (this->keyFed).gid;
          if ((iVar3 == -1700000000) || (iVar3 == -2010000000)) {
            (this->keyFed).gid = (pFVar10->global_id)._M_i.gid;
          }
        }
        else {
          local_188 = (ActionMessage *)(this->super_BrokerBase).identifier._M_dataplus._M_p;
          sVar5 = (this->super_BrokerBase).identifier._M_string_length;
          pbVar6 = (command->payload).heap;
          sVar7 = (command->payload).bufferSize;
          pngrep._16_8_ = commandErrorString(0);
          fmt_00.size_ = 0xcd;
          fmt_00.data_ = (char *)0x37;
          args_00.field_1.args_ = in_R9.args_;
          args_00.desc_ = (unsigned_long_long)&pngrep;
          pngrep._0_8_ = pbVar6;
          pngrep._8_8_ = sVar7;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_180,(v11 *)"broker responded with error for registration of {}::{}\n",
                     fmt_00,args_00);
          local_138 = local_180._M_string_length;
          pcStack_130 = local_180._M_dataplus._M_p;
          message_02._M_str = local_180._M_dataplus._M_p;
          message_02._M_len = local_180._M_string_length;
          name_02._M_str = (char *)local_188;
          name_02._M_len = sVar5;
          BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,0,name_02,message_02,false);
          std::__cxx11::string::~string((string *)&local_180);
        }
        FederateState::addAction(pFVar10,command);
        return;
      }
      if (aVar2 == cmd_route_ack) {
        return;
      }
      if (aVar2 == cmd_register_route) {
        (*(this->super_Core)._vptr_Core[0x6d])
                  (this,(ulong)(uint)(command->dest_handle).hid,0,(command->payload).bufferSize,
                   (command->payload).heap);
        return;
      }
      if (aVar2 == cmd_priority_disconnect) {
        checkAndProcessDisconnect(this);
        return;
      }
      if (aVar2 != cmd_ping_priority) {
        if (aVar2 < cmd_ignore) {
          return;
        }
        processCommand(this,command);
        return;
      }
      if ((command->dest_id).gid != (this->super_BrokerBase).global_broker_id_local.gid) {
        return;
      }
      ActionMessage::ActionMessage(&pngrep,cmd_ping_reply);
      pngrep.dest_id.gid = (command->source_id).gid;
      pngrep.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      routeMessage(this,&pngrep);
    }
    goto LAB_0024f576;
  }
  GVar13.gid = (command->dest_id).gid;
  if (GVar13.gid == (this->super_BrokerBase).global_broker_id_local.gid) {
LAB_0024f8ea:
    processCommandInstruction(this,command);
  }
  else {
    if (GVar13.gid == 0) {
      __lhs = ActionMessage::getString_abi_cxx11_(command,0);
      bVar8 = std::operator==(__lhs,"core");
      if ((bVar8) || (_Var9 = std::operator==(__lhs,&(this->super_BrokerBase).identifier), _Var9))
      goto LAB_0024f8ea;
      federateName_01._M_str = (__lhs->_M_dataplus)._M_p;
      federateName_01._M_len = __lhs->_M_string_length;
      pFVar10 = getFederateCore(this,federateName_01);
      if (pFVar10 == (FederateState *)0x0) {
        GVar13.gid = (command->dest_id).gid;
        goto LAB_0024f958;
      }
    }
    else {
LAB_0024f958:
      bVar8 = isLocal(this,GVar13);
      if ((!bVar8) ||
         (pFVar10 = getFederateCore(this,(GlobalFederateId)(command->dest_id).gid),
         pFVar10 == (FederateState *)0x0)) {
        routeMessage(this,command);
        return;
      }
    }
    FederateState::sendCommand(pFVar10,command);
  }
  return;
}

Assistant:

void CommonCore::processPriorityCommand(ActionMessage&& command)
{
    // deal with a few types of message immediately
    LOG_TRACE(global_broker_id_local,
              getIdentifier(),
              fmt::format("|| priority_cmd:{} from {}",
                          prettyPrintString(command),
                          command.source_id.baseValue()));
    switch (command.action()) {
        case CMD_PING_PRIORITY:
            if (command.dest_id == global_broker_id_local) {
                ActionMessage pngrep(CMD_PING_REPLY);
                pngrep.dest_id = command.source_id;
                pngrep.source_id = global_broker_id_local;
                routeMessage(pngrep);
            }
            break;
        case CMD_REG_FED: {
            // this one in the core needs to be the thread-safe version of getFederate
            auto insertRes =
                loopFederates.insert(command.name(), no_search, getFederate(command.name()));
            if (!insertRes && checkActionFlag(command, reentrant_flag)) {
                auto lfed = loopFederates.find(command.name());
                lfed->state = OperatingState::OPERATING;
            }

            if (global_broker_id_local != parent_broker_id) {
                // forward on to Broker
                command.source_id = global_broker_id_local;
                transmit(parent_route_id, std::move(command));
            } else {
                // this will get processed when this core is assigned a global hid
                delayTransmitQueue.push(std::move(command));
            }

        } break;
        case CMD_BROKER_LOCATION: {
            command.setAction(CMD_PROTOCOL);
            command.messageID = NEW_BROKER_INFORMATION;
            transmit(control_route, std::move(command));
            ActionMessage resend(CMD_RESEND);
            resend.messageID = static_cast<int32_t>(CMD_REG_BROKER);
            addActionMessage(resend);
        } break;
        case CMD_REG_BROKER:
            // These really shouldn't happen here probably means something went wrong in setup but
            // we can handle it forward the connection request to the higher level
            if (command.name() == identifier) {
                LOG_ERROR(
                    global_broker_id_local,
                    identifier,
                    "received locally sent registration message, broker loop, please set the broker address to "
                    "a valid broker");
            } else {
                LOG_WARNING(parent_broker_id,
                            identifier,
                            "Core received reg broker message, likely improper federation setup\n");
                transmit(parent_route_id, command);
            }
            break;
        case CMD_BROKER_ACK:
            if (command.name() == identifier) {
                if (checkActionFlag(command, error_flag)) {
                    auto estring =
                        std::string("broker responded with error: ") + errorMessageString(command);
                    setErrorState(command.messageID, estring);
                    errorRespondDelayedMessages(estring);
                    LOG_ERROR(parent_broker_id, identifier, estring);
                    break;
                }
                global_id = GlobalBrokerId{command.dest_id};
                global_broker_id_local = GlobalBrokerId{command.dest_id};
                filterFedID = getSpecialFederateId(global_broker_id_local, 0);
                translatorFedID = getSpecialFederateId(global_broker_id_local, 1);
                timeCoord->setSourceId(global_broker_id_local);

                higher_broker_id = GlobalBrokerId{command.source_id};
                transmitDelayedMessages();
                timeoutMon->setParentId(higher_broker_id);
                if (checkActionFlag(command, slow_responding_flag)) {
                    timeoutMon->disableParentPing();
                }
                if (checkActionFlag(command, global_timing_flag)) {
                    globalTime = true;
                    if (checkActionFlag(command, async_timing_flag)) {
                        asyncTime = true;
                    }
                }
                if (checkActionFlag(command, global_disconnect_flag)) {
                    globalDisconnect = true;
                }
                timeoutMon->reset();
                if (delayInitCounter < 0 && minFederateCount == 0 && minChildCount == 0) {
                    if (allInitReady()) {
                        if (transitionBrokerState(BrokerState::CONNECTED,
                                                  BrokerState::INITIALIZING)) {
                            // make sure we only do this once
                            ActionMessage init(CMD_INIT);
                            if (initIterations.load()) {
                                setActionFlag(init, iteration_requested_flag);
                            }
                            checkDependencies();
                            init.source_id = global_broker_id_local;
                            init.dest_id = parent_broker_id;
                            transmit(parent_route_id, init);
                        }
                    }
                }
            }
            break;
        case CMD_FED_ACK: {
            FederateState* fed{nullptr};
            fed = getFederateCore(command.name());
            if (fed != nullptr) {
                if (checkActionFlag(command, error_flag)) {
                    LOG_ERROR(
                        parent_broker_id,
                        identifier,
                        fmt::format("broker responded with error for registration of {}::{}\n",
                                    command.name(),
                                    commandErrorString(command.messageID)));
                } else {
                    fed->global_id = command.dest_id;
                    loopFederates.addSearchTerm(command.dest_id, command.name());
                    if (!keyFed.isValid()) {
                        keyFed = fed->global_id;
                    }
                }

                // push the command to the local queue
                fed->addAction(std::move(command));
            }
        } break;
        case CMD_REG_ROUTE:
            // TODO(PT): double check this
            addRoute(route_id(command.getExtraData()), 0, command.payload.to_string());
            break;
        case CMD_PRIORITY_DISCONNECT:
            checkAndProcessDisconnect();
            break;
        case CMD_SEND_COMMAND:
            if (command.dest_id == global_broker_id_local) {
                processCommandInstruction(command);
                break;
            }
            if (command.dest_id == parent_broker_id) {
                const auto& target = command.getString(targetStringLoc);
                if (target == "core" || target == getIdentifier()) {
                    processCommandInstruction(command);
                    break;
                }
                auto* fed = getFederateCore(target);
                if (fed != nullptr) {
                    fed->sendCommand(command);
                    break;
                }
            }
            if (isLocal(command.dest_id)) {
                auto* fed = getFederateCore(command.dest_id);
                if (fed != nullptr) {
                    fed->sendCommand(command);
                    break;
                }
            }
            routeMessage(std::move(command));
            break;
        case CMD_BROKER_QUERY:
        case CMD_QUERY:
        case CMD_QUERY_REPLY:
            processQueryCommand(command);
            break;
        case CMD_PRIORITY_ACK:
        case CMD_ROUTE_ACK:
            break;
        case CMD_SET_GLOBAL:
            if (global_broker_id_local != parent_broker_id) {
                // forward on to Broker
                command.source_id = global_broker_id_local;
                transmit(parent_route_id, std::move(command));
            } else {
                // this will get processed when this core is assigned a global hid
                delayTransmitQueue.push(std::move(command));
            }
            break;
        default: {
            if (!isPriorityCommand(command)) {
                processCommand(std::move(command));
            }
        }
    }
}